

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_mdef_gen.c
# Opt level: O2

int32 find_threshold(hashelement_t **triphonehash)

{
  int iVar1;
  int iVar2;
  hashelement_t *phVar3;
  int iVar4;
  int iVar5;
  cmd_ln_t *pcVar6;
  ulong uVar7;
  long lVar8;
  void *ptr;
  void *ptr_00;
  long lVar9;
  int *piVar10;
  hashelement_t **pphVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  
  pcVar6 = cmd_ln_get();
  uVar7 = cmd_ln_int_r(pcVar6,"-minocc");
  pcVar6 = cmd_ln_get();
  lVar8 = cmd_ln_int_r(pcVar6,"-maxtriphones");
  iVar2 = (int)uVar7;
  iVar4 = iVar2 + 1;
  if (iVar2 < 10000) {
    iVar4 = 10000;
  }
  ptr = __ckd_calloc__((long)(iVar4 + 1),4,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                       ,0x267);
  ptr_00 = __ckd_calloc__((long)(iVar4 + 1),4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                          ,0x268);
  iVar5 = 0;
  uVar15 = 0;
  uVar12 = 0;
  for (lVar9 = 0; lVar9 != 0x5dc1; lVar9 = lVar9 + 1) {
    pphVar11 = triphonehash + lVar9;
    while (phVar3 = *pphVar11, phVar3 != (hashelement_t *)0x0) {
      iVar1 = phVar3->count;
      lVar13 = (long)iVar1;
      if (0 < lVar13) {
        if (iVar2 <= iVar1) {
          iVar5 = iVar5 + 1;
          iVar14 = iVar1;
          if (iVar4 <= iVar1) {
            iVar14 = iVar4;
          }
          lVar13 = (long)iVar14;
          piVar10 = (int *)((long)ptr_00 + lVar13 * 4);
          *piVar10 = *piVar10 + 1;
        }
        uVar15 = (ulong)(uint)((int)uVar15 + iVar1);
        piVar10 = (int *)((long)ptr + lVar13 * 4);
        *piVar10 = *piVar10 + 1;
        uVar12 = uVar12 + 1;
      }
      pphVar11 = &phVar3->next;
    }
  }
  piVar10 = (int *)((long)ptr_00 + (long)iVar2 * 4);
  for (; (int)lVar8 < iVar5; iVar5 = iVar5 - iVar2) {
    iVar2 = *piVar10;
    uVar7 = (ulong)((int)uVar7 + 1);
    piVar10 = piVar10 + 1;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0x280,"%d triphones extracted from transcripts\n",uVar15);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0x281,"%d unique triphones extracted from transcripts\n",(ulong)uVar12);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0x282,"%d triphones occur once in the transcripts\n",(ulong)*(uint *)((long)ptr + 4));
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0x283,"%d triphones occur twice in the transcripts\n",(ulong)*(uint *)((long)ptr + 8));
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0x284,"%d triphones occur thrice in the transcripts\n",(ulong)*(uint *)((long)ptr + 0xc))
  ;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0x285,"The rest of the triphones occur more than three times\n");
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0x286,"Count threshold is %d\n",uVar7 & 0xffffffff);
  ckd_free(ptr_00);
  ckd_free(ptr);
  return (int)uVar7;
}

Assistant:

int32 find_threshold(hashelement_t  **triphonehash)
{
    hashelement_t *triphone_el;
    int32 tottph, ltottph, mincnt, maxtph, *countofcounts, *lcountofcounts;
    int32 i, cnt, unique, threshold, ceiling;

    mincnt = cmd_ln_int32("-minocc");
    maxtph = cmd_ln_int32("-maxtriphones");

    ceiling = mincnt < CEILING ? CEILING : mincnt+1;

    tottph = ltottph = unique = 0;
    countofcounts = (int32 *) ckd_calloc(ceiling+1,sizeof(int32));
    lcountofcounts = (int32 *) ckd_calloc(ceiling+1,sizeof(int32));
    for (i = 0; i < HASHSIZE; i++){
	triphone_el = triphonehash[i];
	while (triphone_el != NULL){
	    cnt = triphone_el->count;
	    if (cnt > 0) {
	        tottph += cnt;
	        if (cnt >= mincnt) {
	            ltottph ++;
		    if (cnt > ceiling) cnt = ceiling;
		    lcountofcounts[cnt]++;
	        }
	        countofcounts[cnt]++; unique++;
	    }
	    triphone_el = triphone_el->next;
	}
    }

    threshold = mincnt; 
    while (ltottph > maxtph) {
	ltottph -= lcountofcounts[threshold];
	threshold++;
    }

    E_INFO("%d triphones extracted from transcripts\n",tottph);
    E_INFO("%d unique triphones extracted from transcripts\n",unique);
    E_INFO("%d triphones occur once in the transcripts\n",countofcounts[1]);
    E_INFO("%d triphones occur twice in the transcripts\n",countofcounts[2]);
    E_INFO("%d triphones occur thrice in the transcripts\n",countofcounts[3]);
    E_INFO("The rest of the triphones occur more than three times\n");
    E_INFO("Count threshold is %d\n",threshold);

    ckd_free(lcountofcounts); ckd_free(countofcounts);
    return(threshold);
}